

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O0

void __thiscall
VW::config::options_serializer_boost_po::serialize<unsigned_long>
          (options_serializer_boost_po *this,
          typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *typed_option)

{
  bool bVar1;
  size_type sVar2;
  reference puVar3;
  typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  unsigned_long *value;
  iterator __end0;
  iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vec;
  ostream *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  typed_option<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::value(in_RSI);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
  if (sVar2 != 0) {
    local_30 = &local_28;
    local_38._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffff88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffff90,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_38);
      in_stack_ffffffffffffff90 = std::operator<<((ostream *)(in_RDI + 1)," --");
      std::operator<<(in_stack_ffffffffffffff90,(string *)&(in_RSI->super_base_option).m_name);
      in_stack_ffffffffffffff88 = std::operator<<((ostream *)(in_RDI + 1)," ");
      std::ostream::operator<<(in_stack_ffffffffffffff88,*puVar3);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_38);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RDI);
  return;
}

Assistant:

void serialize(typed_option<std::vector<T>> typed_option)
  {
    auto vec = typed_option.value();
    if (vec.size() > 0)
    {
      for (auto const& value : vec)
      {
        m_output_stream << " --" << typed_option.m_name;
        m_output_stream << " " << value;
      }
    }
  }